

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

_tExecReaction __thiscall yactfr::internal::Vm::_execSetPktInfo(Vm *this,Instr *param_1)

{
  Size SVar1;
  
  (this->_pos).elems.pktInfo._expectedTotalLen.super_type.m_initialized = false;
  (this->_pos).elems.pktInfo._expectedContentLen.super_type.m_initialized = false;
  SVar1 = (this->_pos).curExpectedPktTotalLenBits;
  if (SVar1 != 0xffffffffffffffff) {
    (this->_pos).elems.pktInfo._expectedTotalLen.super_type.m_storage = SVar1;
    (this->_pos).elems.pktInfo._expectedTotalLen.super_type.m_initialized = true;
  }
  SVar1 = (this->_pos).curExpectedPktContentLenBits;
  if (SVar1 != 0xffffffffffffffff) {
    (this->_pos).elems.pktInfo._expectedContentLen.super_type.m_storage = SVar1;
    (this->_pos).elems.pktInfo._expectedContentLen.super_type.m_initialized = true;
  }
  _updateItForUser(this,&(this->_pos).elems.pktInfo.super_Element);
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execSetPktInfo(const Instr&)
{
    _pos.elems.pktInfo._expectedTotalLen = boost::none;
    _pos.elems.pktInfo._expectedContentLen = boost::none;

    if (_pos.curExpectedPktTotalLenBits != std::numeric_limits<Size>::max()) {
        _pos.elems.pktInfo._expectedTotalLen = _pos.curExpectedPktTotalLenBits;
    }

    if (_pos.curExpectedPktContentLenBits != std::numeric_limits<Size>::max()) {
        _pos.elems.pktInfo._expectedContentLen = _pos.curExpectedPktContentLenBits;
    }
    this->_updateItForUser(_pos.elems.pktInfo);
    return _tExecReaction::FetchNextInstrAndStop;
}